

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

int stbtt_InitFont_internal(stbtt_fontinfo *info,uchar *data,int fontstart)

{
  uchar *puVar1;
  uint uVar2;
  stbtt__buf fontdict;
  stbtt__buf cff_00;
  byte bVar3;
  stbtt_uint16 sVar4;
  stbtt_uint32 sVar5;
  stbtt_uint32 sVar6;
  undefined4 in_EDX;
  long in_RSI;
  stbtt__buf *in_RDI;
  stbtt__buf sVar7;
  stbtt_uint32 encoding_record;
  stbtt_uint32 cff;
  stbtt_uint32 fdselectoff;
  stbtt_uint32 fdarrayoff;
  stbtt_uint32 charstrings;
  stbtt_uint32 cstype;
  stbtt__buf topdictidx;
  stbtt__buf topdict;
  stbtt__buf b;
  stbtt_int32 numTables;
  stbtt_int32 i;
  stbtt_uint32 t;
  stbtt_uint32 cmap;
  int in_stack_fffffffffffffe5c;
  undefined4 in_stack_fffffffffffffe60;
  undefined4 in_stack_fffffffffffffe64;
  char *in_stack_fffffffffffffe68;
  stbtt__buf *in_stack_fffffffffffffe70;
  int in_stack_fffffffffffffe78;
  int in_stack_fffffffffffffe7c;
  stbtt__buf *b_00;
  stbtt__buf *psVar8;
  stbtt__buf *psVar9;
  stbtt__buf *psVar10;
  uchar *local_118;
  undefined8 local_110;
  uchar *local_108;
  undefined8 local_100;
  uchar *local_b8;
  undefined8 local_b0;
  uchar *local_a8;
  undefined8 local_a0;
  uchar *local_98;
  undefined8 local_90;
  stbtt__buf local_50;
  stbtt__buf local_40;
  uint local_2c;
  int local_28;
  stbtt_uint32 local_24;
  stbtt_uint32 local_20;
  long local_18;
  stbtt__buf *local_10;
  int local_4;
  
  in_RDI->cursor = (int)in_RSI;
  in_RDI->size = (int)((ulong)in_RSI >> 0x20);
  *(undefined4 *)&in_RDI[1].data = in_EDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  sVar7 = stbtt__new_buf((void *)0x0,0);
  local_40.data = sVar7.data;
  in_RDI[4].data = local_40.data;
  local_40._8_8_ = sVar7._8_8_;
  in_RDI[4].cursor = local_40.cursor;
  in_RDI[4].size = local_40.size;
  local_40 = sVar7;
  local_20 = stbtt__find_table((stbtt_uint8 *)
                               CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),
                               (stbtt_uint32)((ulong)in_stack_fffffffffffffe70 >> 0x20),
                               in_stack_fffffffffffffe68);
  sVar5 = stbtt__find_table((stbtt_uint8 *)
                            CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),
                            (stbtt_uint32)((ulong)in_stack_fffffffffffffe70 >> 0x20),
                            in_stack_fffffffffffffe68);
  local_10[1].cursor = sVar5;
  sVar5 = stbtt__find_table((stbtt_uint8 *)
                            CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),
                            (stbtt_uint32)((ulong)in_stack_fffffffffffffe70 >> 0x20),
                            in_stack_fffffffffffffe68);
  local_10[1].size = sVar5;
  sVar5 = stbtt__find_table((stbtt_uint8 *)
                            CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),
                            (stbtt_uint32)((ulong)in_stack_fffffffffffffe70 >> 0x20),
                            in_stack_fffffffffffffe68);
  *(stbtt_uint32 *)&local_10[2].data = sVar5;
  sVar5 = stbtt__find_table((stbtt_uint8 *)
                            CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),
                            (stbtt_uint32)((ulong)in_stack_fffffffffffffe70 >> 0x20),
                            in_stack_fffffffffffffe68);
  *(stbtt_uint32 *)((long)&local_10[2].data + 4) = sVar5;
  sVar5 = stbtt__find_table((stbtt_uint8 *)
                            CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),
                            (stbtt_uint32)((ulong)in_stack_fffffffffffffe70 >> 0x20),
                            in_stack_fffffffffffffe68);
  local_10[2].cursor = sVar5;
  sVar5 = stbtt__find_table((stbtt_uint8 *)
                            CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),
                            (stbtt_uint32)((ulong)in_stack_fffffffffffffe70 >> 0x20),
                            in_stack_fffffffffffffe68);
  local_10[2].size = sVar5;
  sVar5 = stbtt__find_table((stbtt_uint8 *)
                            CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),
                            (stbtt_uint32)((ulong)in_stack_fffffffffffffe70 >> 0x20),
                            in_stack_fffffffffffffe68);
  *(stbtt_uint32 *)&local_10[3].data = sVar5;
  if ((((local_20 == 0) || (local_10[1].size == 0)) || (*(int *)((long)&local_10[2].data + 4) == 0))
     || (local_10[2].cursor == 0)) {
    local_4 = 0;
  }
  else {
    sVar5 = (stbtt_uint32)((ulong)in_stack_fffffffffffffe70 >> 0x20);
    if (*(int *)&local_10[2].data == 0) {
      sVar5 = stbtt__find_table((stbtt_uint8 *)
                                CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),sVar5,
                                in_stack_fffffffffffffe68);
      if (sVar5 == 0) {
        local_4 = 0;
      }
      else {
        b_00 = local_10;
        sVar7 = stbtt__new_buf((void *)0x0,0);
        local_98 = sVar7.data;
        b_00[8].data = local_98;
        local_90 = sVar7._8_8_;
        b_00[8].cursor = (undefined4)local_90;
        b_00[8].size = local_90._4_4_;
        psVar8 = local_10;
        sVar7 = stbtt__new_buf((void *)0x0,0);
        local_a8 = sVar7.data;
        psVar8[9].data = local_a8;
        local_a0 = sVar7._8_8_;
        psVar8[9].cursor = (undefined4)local_a0;
        psVar8[9].size = local_a0._4_4_;
        psVar9 = local_10;
        sVar7 = stbtt__new_buf((void *)(local_18 + (ulong)sVar5),0x20000000);
        local_b8 = sVar7.data;
        psVar9[4].data = local_b8;
        local_b0 = sVar7._8_8_;
        psVar9[4].cursor = (undefined4)local_b0;
        psVar9[4].size = local_b0._4_4_;
        local_50.data = local_10[4].data;
        local_50.cursor = local_10[4].cursor;
        local_50.size = local_10[4].size;
        stbtt__buf_skip((stbtt__buf *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                        in_stack_fffffffffffffe5c);
        bVar3 = stbtt__buf_get8(&local_50);
        stbtt__buf_seek(&local_50,(uint)bVar3);
        stbtt__cff_get_index(in_stack_fffffffffffffe70);
        stbtt__cff_get_index(in_stack_fffffffffffffe70);
        sVar7.data._4_4_ = in_stack_fffffffffffffe7c;
        sVar7.data._0_4_ = in_stack_fffffffffffffe78;
        sVar7._8_8_ = b_00;
        stbtt__cff_index_get(sVar7,(int)((ulong)in_stack_fffffffffffffe70 >> 0x20));
        stbtt__cff_get_index(in_stack_fffffffffffffe70);
        psVar10 = local_10;
        sVar7 = stbtt__cff_get_index(in_stack_fffffffffffffe70);
        local_108 = sVar7.data;
        psVar10[6].data = local_108;
        local_100 = sVar7._8_8_;
        psVar10[6].cursor = (undefined4)local_100;
        psVar10[6].size = local_100._4_4_;
        stbtt__dict_get_ints
                  (b_00,in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78,
                   (stbtt_uint32 *)in_stack_fffffffffffffe70);
        stbtt__dict_get_ints
                  (b_00,in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78,
                   (stbtt_uint32 *)in_stack_fffffffffffffe70);
        stbtt__dict_get_ints
                  (b_00,in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78,
                   (stbtt_uint32 *)in_stack_fffffffffffffe70);
        stbtt__dict_get_ints
                  (b_00,in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78,
                   (stbtt_uint32 *)in_stack_fffffffffffffe70);
        cff_00._8_8_ = local_10;
        cff_00.data = (uchar *)psVar10;
        fontdict._8_8_ = psVar9;
        fontdict.data = (uchar *)psVar8;
        sVar7 = stbtt__get_subrs(cff_00,fontdict);
        local_118 = sVar7.data;
        local_10[7].data = local_118;
        local_110 = sVar7._8_8_;
        local_10[7].cursor = (undefined4)local_110;
        local_10[7].size = local_110._4_4_;
        local_4 = 0;
      }
    }
    else if (local_10[1].cursor == 0) {
      local_4 = 0;
    }
    else {
      local_24 = stbtt__find_table((stbtt_uint8 *)
                                   CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),
                                   sVar5,in_stack_fffffffffffffe68);
      if (local_24 == 0) {
        puVar1 = (uchar *)((long)&local_10[1].data + 4);
        puVar1[0] = 0xff;
        puVar1[1] = 0xff;
        puVar1[2] = '\0';
        puVar1[3] = '\0';
      }
      else {
        sVar4 = ttUSHORT((stbtt_uint8 *)(local_18 + (ulong)local_24 + 4));
        *(uint *)((long)&local_10[1].data + 4) = (uint)sVar4;
      }
      puVar1 = (uchar *)((long)&local_10[3].data + 4);
      puVar1[0] = 0xff;
      puVar1[1] = 0xff;
      puVar1[2] = 0xff;
      puVar1[3] = 0xff;
      sVar4 = ttUSHORT((stbtt_uint8 *)(local_18 + (ulong)local_20 + 2));
      local_2c = (uint)sVar4;
      local_10[3].cursor = 0;
      for (local_28 = 0; local_28 < (int)local_2c; local_28 = local_28 + 1) {
        uVar2 = local_20 + 4 + local_28 * 8;
        sVar4 = ttUSHORT((stbtt_uint8 *)(local_18 + (ulong)uVar2));
        if (sVar4 == 0) {
          sVar5 = local_20;
          sVar6 = ttULONG((stbtt_uint8 *)(local_18 + (ulong)uVar2 + 4));
          local_10[3].cursor = sVar5 + sVar6;
        }
        else if ((sVar4 == 3) &&
                ((sVar4 = ttUSHORT((stbtt_uint8 *)(local_18 + 2 + (ulong)uVar2)), sVar4 == 1 ||
                 (sVar4 == 10)))) {
          sVar5 = local_20;
          sVar6 = ttULONG((stbtt_uint8 *)(local_18 + (ulong)uVar2 + 4));
          local_10[3].cursor = sVar5 + sVar6;
        }
      }
      if (local_10[3].cursor == 0) {
        local_4 = 0;
      }
      else {
        sVar4 = ttUSHORT((stbtt_uint8 *)(local_18 + local_10[1].size + 0x32));
        local_10[3].size = (uint)sVar4;
        local_4 = 1;
      }
    }
  }
  return local_4;
}

Assistant:

static int stbtt_InitFont_internal(stbtt_fontinfo *info, unsigned char *data, int fontstart)
{
stbtt_uint32 cmap, t;
stbtt_int32 i,numTables;

info->data = data;
info->fontstart = fontstart;
info->cff = stbtt__new_buf(NULL, 0);

cmap = stbtt__find_table(data, fontstart, "cmap");       /*  required */
info->loca = stbtt__find_table(data, fontstart, "loca"); /*  required */
info->head = stbtt__find_table(data, fontstart, "head"); /*  required */
info->glyf = stbtt__find_table(data, fontstart, "glyf"); /*  required */
info->hhea = stbtt__find_table(data, fontstart, "hhea"); /*  required */
info->hmtx = stbtt__find_table(data, fontstart, "hmtx"); /*  required */
info->kern = stbtt__find_table(data, fontstart, "kern"); /*  not required */
info->gpos = stbtt__find_table(data, fontstart, "GPOS"); /*  not required */

if (!cmap || !info->head || !info->hhea || !info->hmtx)
return 0;
if (info->glyf) {
/*  required for truetype */
if (!info->loca) return 0;
} else {
/*  initialization for CFF / Type2 fonts (OTF) */
stbtt__buf b, topdict, topdictidx;
stbtt_uint32 cstype = 2, charstrings = 0, fdarrayoff = 0, fdselectoff = 0;
stbtt_uint32 cff;

cff = stbtt__find_table(data, fontstart, "CFF ");
if (!cff) return 0;

info->fontdicts = stbtt__new_buf(NULL, 0);
info->fdselect = stbtt__new_buf(NULL, 0);

/*  @TODO this should use size from table (not 512MB) */
info->cff = stbtt__new_buf(data+cff, 512*1024*1024);
b = info->cff;

/*  read the header */
stbtt__buf_skip(&b, 2);
stbtt__buf_seek(&b, stbtt__buf_get8(&b)); /*  hdrsize */

/*  @TODO the name INDEX could list multiple fonts, */
/*  but we just use the first one. */
stbtt__cff_get_index(&b);  /*  name INDEX */
topdictidx = stbtt__cff_get_index(&b);
topdict = stbtt__cff_index_get(topdictidx, 0);
stbtt__cff_get_index(&b);  /*  string INDEX */
info->gsubrs = stbtt__cff_get_index(&b);

stbtt__dict_get_ints(&topdict, 17, 1, &charstrings);
stbtt__dict_get_ints(&topdict, 0x100 | 6, 1, &cstype);
stbtt__dict_get_ints(&topdict, 0x100 | 36, 1, &fdarrayoff);
stbtt__dict_get_ints(&topdict, 0x100 | 37, 1, &fdselectoff);
info->subrs = stbtt__get_subrs(b, topdict);

/*  we only support Type 2 charstrings */
if (cstype != 2) return 0;
if (charstrings == 0) return 0;

if (fdarrayoff) {
/*  looks like a CID font */
if (!fdselectoff) return 0;
stbtt__buf_seek(&b, fdarrayoff);
info->fontdicts = stbtt__cff_get_index(&b);
info->fdselect = stbtt__buf_range(&b, fdselectoff, b.size-fdselectoff);
}

stbtt__buf_seek(&b, charstrings);
info->charstrings = stbtt__cff_get_index(&b);
}

t = stbtt__find_table(data, fontstart, "maxp");
if (t)
info->numGlyphs = ttUSHORT(data+t+4);
else
info->numGlyphs = 0xffff;

info->svg = -1;

/*  find a cmap encoding table we understand *now* to avoid searching */
/*  later. (todo: could make this installable) */
/*  the same regardless of glyph. */
numTables = ttUSHORT(data + cmap + 2);
info->index_map = 0;
for (i=0; i < numTables; ++i) {
stbtt_uint32 encoding_record = cmap + 4 + 8 * i;
/*  find an encoding we understand: */
switch(ttUSHORT(data+encoding_record)) {
case STBTT_PLATFORM_ID_MICROSOFT:
switch (ttUSHORT(data+encoding_record+2)) {
case STBTT_MS_EID_UNICODE_BMP:
case STBTT_MS_EID_UNICODE_FULL:
/*  MS/Unicode */
info->index_map = cmap + ttULONG(data+encoding_record+4);
break;
}
break;
case STBTT_PLATFORM_ID_UNICODE:
/*  Mac/iOS has these */
/*  all the encodingIDs are unicode, so we don't bother to check it */
info->index_map = cmap + ttULONG(data+encoding_record+4);
break;
}
}
if (info->index_map == 0)
return 0;

info->indexToLocFormat = ttUSHORT(data+info->head + 50);
return 1;
}